

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O1

void __thiscall KDReports::Test::testExportAsSinglePage(Test *this)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  qsizetype qVar4;
  bool bVar5;
  char cVar6;
  AutoTableElement *pAVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  reference t1;
  double dVar11;
  QByteArrayView QVar12;
  QString filename;
  QTemporaryFile tempFile;
  Report report;
  QFont font;
  QPixmap pix;
  char msg [128];
  QRect local_30;
  
  fillModel(this,1,0x28,false);
  KDReports::Report::Report(&report,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)&report);
  pAVar7 = (AutoTableElement *)KDReports::Report::mainTable();
  KDReports::AutoTableElement::AutoTableElement
            ((AutoTableElement *)msg,(QAbstractItemModel *)&this->m_model);
  KDReports::MainTable::setAutoTableElement(pAVar7);
  KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)msg);
  KDReports::Report::scaleTo((int)&report,1);
  filename.d.d = (Data *)0x0;
  filename.d.ptr = (char16_t *)0x0;
  filename.d.size = 0;
  QByteArrayView::QByteArrayView<char,_true>((QByteArrayView *)&pix,"Noto Sans",9);
  QVar12.m_data = _pix;
  QVar12.m_size = (qsizetype)msg;
  QString::fromLatin1(QVar12);
  qVar3 = filename.d.size;
  pcVar2 = filename.d.ptr;
  pDVar1 = filename.d.d;
  filename.d.d = (Data *)msg._0_8_;
  msg._0_8_ = pDVar1;
  filename.d.ptr = (char16_t *)msg._8_8_;
  filename.d.size._0_1_ = msg[0x10];
  filename.d.size._1_1_ = msg[0x11];
  filename.d.size._2_1_ = msg[0x12];
  filename.d.size._3_1_ = msg[0x13];
  filename.d.size._4_1_ = msg[0x14];
  filename.d.size._5_1_ = msg[0x15];
  filename.d.size._6_1_ = msg[0x16];
  filename.d.size._7_1_ = msg[0x17];
  qVar4 = filename.d.size;
  msg._8_8_ = pcVar2;
  filename.d.size._0_1_ = (undefined1)qVar3;
  filename.d.size._1_1_ = SUB81(qVar3,1);
  filename.d.size._2_1_ = SUB81(qVar3,2);
  filename.d.size._3_1_ = SUB81(qVar3,3);
  filename.d.size._4_1_ = SUB81(qVar3,4);
  filename.d.size._5_1_ = SUB81(qVar3,5);
  filename.d.size._6_1_ = SUB81(qVar3,6);
  filename.d.size._7_1_ = SUB81(qVar3,7);
  msg[0x10] = (undefined1)filename.d.size;
  msg[0x11] = filename.d.size._1_1_;
  msg[0x12] = filename.d.size._2_1_;
  msg[0x13] = filename.d.size._3_1_;
  msg[0x14] = filename.d.size._4_1_;
  msg[0x15] = filename.d.size._5_1_;
  msg[0x16] = filename.d.size._6_1_;
  msg[0x17] = filename.d.size._7_1_;
  filename.d.size = qVar4;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)msg);
  QFont::QFont(&font,&filename,-1,-1,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&filename.d);
  QFont::setPointSize((int)&font);
  KDReports::Report::setDefaultFont((QFont *)&report);
  QTemporaryFile::QTemporaryFile(&tempFile);
  bVar5 = (bool)(**(code **)(_tempFile + 0x68))(&tempFile,3);
  cVar6 = QTest::qVerify(bVar5,"tempFile.open()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                         ,0x21d);
  if (cVar6 != '\0') {
    QTemporaryFile::fileName();
    QFileDevice::close();
    bVar5 = (bool)KDReports::Report::exportToImage
                            ((QSize)&report,(QString *)0x7d0000003e8,(char *)&filename);
    cVar6 = QTest::qVerify(bVar5,"ok","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x222);
    if (cVar6 != '\0') {
      bVar5 = (bool)QFile::exists(&filename);
      cVar6 = QTest::qVerify(bVar5,"QFile::exists(filename)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x223);
      if (cVar6 != '\0') {
        QPixmap::QPixmap(&pix);
        bVar5 = (bool)QPixmap::load(&pix,&filename,0,0);
        cVar6 = QTest::qVerify(bVar5,"pix.load(filename)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0x225);
        if (cVar6 != '\0') {
          uVar8 = QPixmap::size();
          msg[0x70] = '\0';
          msg[0x71] = '\0';
          msg[0x72] = '\0';
          msg[0x73] = '\0';
          msg[0x74] = '\0';
          msg[0x75] = '\0';
          msg[0x76] = '\0';
          msg[0x77] = '\0';
          msg[0x78] = '\0';
          msg[0x79] = '\0';
          msg[0x7a] = '\0';
          msg[0x7b] = '\0';
          msg[0x7c] = '\0';
          msg[0x7d] = '\0';
          msg[0x7e] = '\0';
          msg[0x7f] = '\0';
          msg[0x60] = '\0';
          msg[0x61] = '\0';
          msg[0x62] = '\0';
          msg[99] = '\0';
          msg[100] = '\0';
          msg[0x65] = '\0';
          msg[0x66] = '\0';
          msg[0x67] = '\0';
          msg[0x68] = '\0';
          msg[0x69] = '\0';
          msg[0x6a] = '\0';
          msg[0x6b] = '\0';
          msg[0x6c] = '\0';
          msg[0x6d] = '\0';
          msg[0x6e] = '\0';
          msg[0x6f] = '\0';
          msg[0x50] = '\0';
          msg[0x51] = '\0';
          msg[0x52] = '\0';
          msg[0x53] = '\0';
          msg[0x54] = '\0';
          msg[0x55] = '\0';
          msg[0x56] = '\0';
          msg[0x57] = '\0';
          msg[0x58] = '\0';
          msg[0x59] = '\0';
          msg[0x5a] = '\0';
          msg[0x5b] = '\0';
          msg[0x5c] = '\0';
          msg[0x5d] = '\0';
          msg[0x5e] = '\0';
          msg[0x5f] = '\0';
          msg[0x40] = '\0';
          msg[0x41] = '\0';
          msg[0x42] = '\0';
          msg[0x43] = '\0';
          msg[0x44] = '\0';
          msg[0x45] = '\0';
          msg[0x46] = '\0';
          msg[0x47] = '\0';
          msg[0x48] = '\0';
          msg[0x49] = '\0';
          msg[0x4a] = '\0';
          msg[0x4b] = '\0';
          msg[0x4c] = '\0';
          msg[0x4d] = '\0';
          msg[0x4e] = '\0';
          msg[0x4f] = '\0';
          msg[0x30] = '\0';
          msg[0x31] = '\0';
          msg[0x32] = '\0';
          msg[0x33] = '\0';
          msg[0x34] = '\0';
          msg[0x35] = '\0';
          msg[0x36] = '\0';
          msg[0x37] = '\0';
          msg[0x38] = '\0';
          msg[0x39] = '\0';
          msg[0x3a] = '\0';
          msg[0x3b] = '\0';
          msg[0x3c] = '\0';
          msg[0x3d] = '\0';
          msg[0x3e] = '\0';
          msg[0x3f] = '\0';
          msg[0x20] = '\0';
          msg[0x21] = '\0';
          msg[0x22] = '\0';
          msg[0x23] = '\0';
          msg[0x24] = '\0';
          msg[0x25] = '\0';
          msg[0x26] = '\0';
          msg[0x27] = '\0';
          msg[0x28] = '\0';
          msg[0x29] = '\0';
          msg[0x2a] = '\0';
          msg[0x2b] = '\0';
          msg[0x2c] = '\0';
          msg[0x2d] = '\0';
          msg[0x2e] = '\0';
          msg[0x2f] = '\0';
          msg[0x10] = '\0';
          msg[0x11] = '\0';
          msg[0x12] = '\0';
          msg[0x13] = '\0';
          msg[0x14] = '\0';
          msg[0x15] = '\0';
          msg[0x16] = '\0';
          msg[0x17] = '\0';
          msg[0x18] = '\0';
          msg[0x19] = '\0';
          msg[0x1a] = '\0';
          msg[0x1b] = '\0';
          msg[0x1c] = '\0';
          msg[0x1d] = '\0';
          msg[0x1e] = '\0';
          msg[0x1f] = '\0';
          msg[0] = '\0';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
          msg[4] = '\0';
          msg[5] = '\0';
          msg[6] = '\0';
          msg[7] = '\0';
          msg[8] = '\0';
          msg[9] = '\0';
          msg[10] = '\0';
          msg[0xb] = '\0';
          msg[0xc] = '\0';
          msg[0xd] = '\0';
          msg[0xe] = '\0';
          msg[0xf] = '\0';
          qsnprintf(msg,0x80,"QSize(%dx%d)",uVar8 & 0xffffffff);
          pcVar9 = (char *)qstrdup(msg);
          msg[0x70] = '\0';
          msg[0x71] = '\0';
          msg[0x72] = '\0';
          msg[0x73] = '\0';
          msg[0x74] = '\0';
          msg[0x75] = '\0';
          msg[0x76] = '\0';
          msg[0x77] = '\0';
          msg[0x78] = '\0';
          msg[0x79] = '\0';
          msg[0x7a] = '\0';
          msg[0x7b] = '\0';
          msg[0x7c] = '\0';
          msg[0x7d] = '\0';
          msg[0x7e] = '\0';
          msg[0x7f] = '\0';
          msg[0x60] = '\0';
          msg[0x61] = '\0';
          msg[0x62] = '\0';
          msg[99] = '\0';
          msg[100] = '\0';
          msg[0x65] = '\0';
          msg[0x66] = '\0';
          msg[0x67] = '\0';
          msg[0x68] = '\0';
          msg[0x69] = '\0';
          msg[0x6a] = '\0';
          msg[0x6b] = '\0';
          msg[0x6c] = '\0';
          msg[0x6d] = '\0';
          msg[0x6e] = '\0';
          msg[0x6f] = '\0';
          msg[0x50] = '\0';
          msg[0x51] = '\0';
          msg[0x52] = '\0';
          msg[0x53] = '\0';
          msg[0x54] = '\0';
          msg[0x55] = '\0';
          msg[0x56] = '\0';
          msg[0x57] = '\0';
          msg[0x58] = '\0';
          msg[0x59] = '\0';
          msg[0x5a] = '\0';
          msg[0x5b] = '\0';
          msg[0x5c] = '\0';
          msg[0x5d] = '\0';
          msg[0x5e] = '\0';
          msg[0x5f] = '\0';
          msg[0x40] = '\0';
          msg[0x41] = '\0';
          msg[0x42] = '\0';
          msg[0x43] = '\0';
          msg[0x44] = '\0';
          msg[0x45] = '\0';
          msg[0x46] = '\0';
          msg[0x47] = '\0';
          msg[0x48] = '\0';
          msg[0x49] = '\0';
          msg[0x4a] = '\0';
          msg[0x4b] = '\0';
          msg[0x4c] = '\0';
          msg[0x4d] = '\0';
          msg[0x4e] = '\0';
          msg[0x4f] = '\0';
          msg[0x30] = '\0';
          msg[0x31] = '\0';
          msg[0x32] = '\0';
          msg[0x33] = '\0';
          msg[0x34] = '\0';
          msg[0x35] = '\0';
          msg[0x36] = '\0';
          msg[0x37] = '\0';
          msg[0x38] = '\0';
          msg[0x39] = '\0';
          msg[0x3a] = '\0';
          msg[0x3b] = '\0';
          msg[0x3c] = '\0';
          msg[0x3d] = '\0';
          msg[0x3e] = '\0';
          msg[0x3f] = '\0';
          msg[0x20] = '\0';
          msg[0x21] = '\0';
          msg[0x22] = '\0';
          msg[0x23] = '\0';
          msg[0x24] = '\0';
          msg[0x25] = '\0';
          msg[0x26] = '\0';
          msg[0x27] = '\0';
          msg[0x28] = '\0';
          msg[0x29] = '\0';
          msg[0x2a] = '\0';
          msg[0x2b] = '\0';
          msg[0x2c] = '\0';
          msg[0x2d] = '\0';
          msg[0x2e] = '\0';
          msg[0x2f] = '\0';
          msg[0x10] = '\0';
          msg[0x11] = '\0';
          msg[0x12] = '\0';
          msg[0x13] = '\0';
          msg[0x14] = '\0';
          msg[0x15] = '\0';
          msg[0x16] = '\0';
          msg[0x17] = '\0';
          msg[0x18] = '\0';
          msg[0x19] = '\0';
          msg[0x1a] = '\0';
          msg[0x1b] = '\0';
          msg[0x1c] = '\0';
          msg[0x1d] = '\0';
          msg[0x1e] = '\0';
          msg[0x1f] = '\0';
          msg[0] = '\0';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
          msg[4] = '\0';
          msg[5] = '\0';
          msg[6] = '\0';
          msg[7] = '\0';
          msg[8] = '\0';
          msg[9] = '\0';
          msg[10] = '\0';
          msg[0xb] = '\0';
          msg[0xc] = '\0';
          msg[0xd] = '\0';
          msg[0xe] = '\0';
          msg[0xf] = '\0';
          qsnprintf(msg,0x80,"QSize(%dx%d)",1000,2000);
          pcVar10 = (char *)qstrdup(msg);
          cVar6 = QTest::compare_helper
                            ((int)uVar8 == 1000 && uVar8 >> 0x20 == 2000,
                             "Compared values are not the same",pcVar9,pcVar10,"pix.size()","size",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x226);
          if (cVar6 != '\0') {
            KDReports::Report::mainTable();
            KDReports::MainTable::pageRects();
            t1 = QList<QRect>::operator[]((QList<QRect> *)msg,0);
            local_30.x1 = 0;
            local_30.y1 = 0;
            local_30.x2 = 0;
            local_30.y2 = 0x27;
            bVar5 = QTest::qCompare<QRect,QRect>
                              (t1,&local_30,"report.mainTable()->pageRects()[0]",
                               "QRect(0, 0, 1, 40)",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0x228);
            QArrayDataPointer<QRect>::~QArrayDataPointer((QArrayDataPointer<QRect> *)msg);
            if (bVar5) {
              KDReports::Report::mainTable();
              dVar11 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
              cVar6 = QTest::qVerify(0.9999 < dVar11,
                                     "report.mainTable()->lastAutoFontScalingFactor() > 0.9999","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                     ,0x229);
              if (cVar6 != '\0') {
                QFile::remove(&filename);
              }
            }
          }
        }
        QPixmap::~QPixmap(&pix);
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&filename.d);
  }
  QTemporaryFile::~QTemporaryFile(&tempFile);
  QFont::~QFont(&font);
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testExportAsSinglePage()
    {
        // Same testcase as testVerticalScaling, for now
        fillModel(1, 40);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.mainTable()->setAutoTableElement(AutoTableElement(&m_model));
        report.scaleTo(1, 2); // must cram 40 rows into 2 page vertically
        QFont font = QFont(QLatin1String(s_fontName));
        font.setPointSize(86); // huge :)
        report.setDefaultFont(font);
        // QCOMPARE(report.numberOfPages(), 2);

        // report.exportToFile( "testExportAsSinglePage.pdf" ); // for debugging

        QTemporaryFile tempFile;
        QVERIFY(tempFile.open());
        const QString filename = tempFile.fileName();
        tempFile.close();
        const QSize size(1000, 2000);
        bool ok = report.exportToImage(size, filename, "PNG");
        QVERIFY(ok);
        QVERIFY(QFile::exists(filename));
        QPixmap pix;
        QVERIFY(pix.load(filename));
        QCOMPARE(pix.size(), size);

        QCOMPARE(report.mainTable()->pageRects()[0], QRect(0, 0, 1, 40));
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() > 0.9999);
        // The only way to truly validate that it worked, though, is to open test-export.jpg and check...

        QFile::remove(filename);
    }